

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *old)

{
  QArrayData *pQVar1;
  QArrayData *data;
  long lVar2;
  qsizetype qVar3;
  QResourceRoot **__dest;
  Int IVar4;
  long lVar5;
  Data *pDVar6;
  long in_FS_OFFSET;
  pair<QArrayData_*,_void_*> pVar7;
  QArrayData *d;
  QArrayData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->d->super_QArrayData;
  if (where == GrowsAtEnd) {
    if (pQVar1 == (QArrayData *)0x0) {
      qVar3 = 0;
      lVar2 = this->size;
      if (this->size < 1) {
        lVar2 = qVar3;
      }
      lVar2 = lVar2 + n;
      goto LAB_00253d33;
    }
    if ((n < 1) || (1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i)) {
      qVar3 = pQVar1->alloc;
      lVar2 = this->size;
      lVar5 = lVar2;
      if (lVar2 - qVar3 == 0 || lVar2 < qVar3) {
        lVar5 = qVar3;
      }
      lVar2 = ((long)((long)this->ptr - ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0))
              >> 3) + lVar5 + n + (lVar2 - qVar3);
      goto LAB_00253d21;
    }
    pVar7 = QArrayData::reallocateUnaligned
                      (pQVar1,this->ptr,8,
                       this->size +
                       ((long)((long)this->ptr -
                              ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) + 1
                       ,Grow);
    if (pVar7.second == (void *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_00253ee2;
    }
    this->d = (Data *)pVar7.first;
    this->ptr = (QResourceRoot **)pVar7.second;
  }
  else {
    if (pQVar1 == (QArrayData *)0x0) {
      qVar3 = 0;
    }
    else {
      qVar3 = pQVar1->alloc;
    }
    if (qVar3 < this->size) {
      qVar3 = this->size;
    }
    lVar2 = (long)((long)this->ptr - ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >>
            3;
    if (pQVar1 == (QArrayData *)0x0) {
      lVar2 = 0;
    }
    lVar2 = (qVar3 + n) - lVar2;
    if (pQVar1 == (QArrayData *)0x0) {
      qVar3 = 0;
    }
    else {
      qVar3 = pQVar1->alloc;
LAB_00253d21:
      lVar5 = lVar2;
      if (lVar2 < qVar3) {
        lVar5 = qVar3;
      }
      if (((pQVar1->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
        lVar2 = lVar5;
      }
    }
LAB_00253d33:
    local_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    __dest = (QResourceRoot **)QArrayData::allocate(&local_40,8,0x10,lVar2,(uint)(lVar2 <= qVar3));
    pQVar1 = local_40;
    if (__dest != (QResourceRoot **)0x0 && local_40 != (QArrayData *)0x0) {
      if (where == GrowsAtBeginning) {
        lVar5 = (local_40->alloc - (this->size + n)) / 2;
        lVar2 = 0;
        if (0 < lVar5) {
          lVar2 = lVar5;
        }
        lVar2 = lVar2 + n;
        pDVar6 = this->d;
      }
      else {
        pDVar6 = this->d;
        lVar2 = (long)((long)this->ptr -
                      ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 3;
        if (pDVar6 == (Data *)0x0) {
          lVar2 = 0;
        }
      }
      if (pDVar6 == (Data *)0x0) {
        IVar4 = 0;
      }
      else {
        IVar4 = (pDVar6->super_QArrayData).flags.
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                super_QFlagsStorage<QArrayData::ArrayOption>.i;
      }
      __dest = __dest + lVar2;
      (local_40->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar4;
    }
    if ((0 < n) && (__dest == (QResourceRoot **)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_00253ee2;
    }
    data = &this->d->super_QArrayData;
    lVar2 = this->size;
    if (lVar2 == 0) {
LAB_00253e14:
      this->d = (Data *)pQVar1;
      this->ptr = __dest;
      this->size = lVar2;
      if (data == (QArrayData *)0x0) goto LAB_00253e5d;
    }
    else {
      if ((data == (QArrayData *)0x0) || (1 < (data->ref_)._q_value.super___atomic_base<int>._M_i))
      {
        memcpy(__dest,this->ptr,lVar2 * 8);
        goto LAB_00253e14;
      }
      memcpy(__dest,this->ptr,lVar2 * 8);
      this->d = (Data *)pQVar1;
      this->ptr = __dest;
      this->size = lVar2;
    }
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,8,0x10);
    }
  }
LAB_00253e5d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00253ee2:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }